

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O0

void __thiscall
TPZEulerAnalysis::CFLControl
          (TPZEulerAnalysis *this,REAL *lastEpsilon,REAL *epsilon,REAL *epsilon_Newton,
          REAL *timeStep)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double *in_R8;
  
  if (((0.0 < *in_RSI) && (0.0 < *in_RDX)) && (0 < *(int *)(in_RDI + 0x53c))) {
    TPZFlowCompMesh::ScaleCFL((TPZFlowCompMesh *)epsilon,(REAL)epsilon_Newton);
    *in_R8 = (*in_RSI / *in_RDX) * *in_R8;
  }
  if ((*in_RCX < *(double *)(in_RDI + 0x520)) && (1 < *(int *)(in_RDI + 0x53c))) {
    TPZFlowCompMesh::ScaleCFL((TPZFlowCompMesh *)epsilon,(REAL)epsilon_Newton);
    *in_R8 = *in_R8 * 2.0;
  }
  if ((*(double *)(in_RDI + 0x520) <= *in_RCX && *in_RCX != *(double *)(in_RDI + 0x520)) &&
     (2 < *(int *)(in_RDI + 0x53c))) {
    TPZFlowCompMesh::ScaleCFL((TPZFlowCompMesh *)epsilon,(REAL)epsilon_Newton);
    *in_R8 = *in_R8 * 0.5;
  }
  *in_RSI = *in_RDX;
  return;
}

Assistant:

void TPZEulerAnalysis::CFLControl(REAL & lastEpsilon, REAL & epsilon, REAL & epsilon_Newton, REAL & timeStep)
{
	// CFL control based on Flux reduction
	if((lastEpsilon>0. && epsilon>0.) && fEvolCFL >= 1)
	{
		fFlowCompMesh->ScaleCFL(lastEpsilon/epsilon);
		timeStep *= lastEpsilon/epsilon;
	}
	
	// CFL control based on Nonlinear invertion
	if(epsilon_Newton < fNewtonEps && fEvolCFL >= 2)
	{
		fFlowCompMesh->ScaleCFL(2.);
		timeStep *= 2.;
	}
	
	if(epsilon_Newton > fNewtonEps && fEvolCFL >= 3)
	{
		fFlowCompMesh->ScaleCFL(.5);
		timeStep *= .5;
	}
	
	lastEpsilon = epsilon;
}